

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::internal::MapFieldPrinterHelper::CopyKey
               (MapKey *key,Message *message,FieldDescriptor *field_desc)

{
  CppType CVar1;
  string *psVar2;
  Reflection *in_RDX;
  FieldDescriptor *in_RSI;
  Reflection *reflection;
  LogMessage *in_stack_fffffffffffffec8;
  LogMessage *in_stack_fffffffffffffed0;
  uint64 in_stack_fffffffffffffed8;
  LogMessage *in_stack_fffffffffffffee0;
  Reflection *pRVar3;
  Message *in_stack_fffffffffffffee8;
  Reflection *in_stack_fffffffffffffef0;
  Reflection *value;
  MapKey *in_stack_ffffffffffffff60;
  Reflection local_88;
  Reflection *local_20;
  Reflection *local_18;
  FieldDescriptor *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = Message::GetReflection((Message *)in_stack_fffffffffffffed0);
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4388e1);
  switch(CVar1) {
  case CPPTYPE_INT32:
    MapKey::GetInt32Value(in_stack_ffffffffffffff60);
    Reflection::SetInt32
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (FieldDescriptor *)in_stack_fffffffffffffee0,
               (int32)(in_stack_fffffffffffffed8 >> 0x20));
    break;
  case CPPTYPE_INT64:
    MapKey::GetInt64Value(in_stack_ffffffffffffff60);
    Reflection::SetInt64
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (FieldDescriptor *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    break;
  case CPPTYPE_UINT32:
    pRVar3 = local_20;
    MapKey::GetUInt32Value(in_stack_ffffffffffffff60);
    Reflection::SetUInt32
              (local_18,(Message *)local_10,(FieldDescriptor *)pRVar3,
               (uint32)(in_stack_fffffffffffffed8 >> 0x20));
    break;
  case CPPTYPE_UINT64:
    MapKey::GetUInt64Value(in_stack_ffffffffffffff60);
    Reflection::SetUInt64
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (FieldDescriptor *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    LogMessage::LogMessage
              (in_stack_fffffffffffffee0,(LogLevel_conflict)(in_stack_fffffffffffffed8 >> 0x20),
               (char *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    LogMessage::operator<<(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    LogMessage::~LogMessage((LogMessage *)0x438976);
    break;
  case CPPTYPE_BOOL:
    MapKey::GetBoolValue(in_stack_ffffffffffffff60);
    Reflection::SetBool(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                        (FieldDescriptor *)in_stack_fffffffffffffee0,
                        SUB81((ulong)local_18 >> 0x38,0));
    break;
  case CPPTYPE_STRING:
    value = local_20;
    psVar2 = MapKey::GetStringValue_abi_cxx11_(in_stack_ffffffffffffff60);
    pRVar3 = &local_88;
    std::__cxx11::string::string((string *)pRVar3,(string *)psVar2);
    Reflection::SetString(pRVar3,(Message *)local_18,local_10,(string *)value);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyKey(const MapKey& key, Message* message,
                                    const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      GOOGLE_LOG(ERROR) << "Not supported.";
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc, key.GetStringValue());
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, key.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, key.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, key.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, key.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, key.GetBoolValue());
      return;
  }
}